

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

void __thiscall cmCMakePath::GetNativePath(cmCMakePath *this,wstring *path)

{
  path tmp;
  path pStack_58;
  wstring local_30;
  
  std::filesystem::__cxx11::path::path(&pStack_58,&this->Path);
  std::filesystem::__cxx11::path::wstring(&local_30,&pStack_58);
  std::__cxx11::wstring::operator=((wstring *)path,(wstring *)&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::filesystem::__cxx11::path::~path(&pStack_58);
  return;
}

Assistant:

void cmCMakePath::GetNativePath(std::wstring& path) const
{
  cm::filesystem::path tmp(this->Path);
  tmp.make_preferred();

  path = tmp.wstring();

#if defined(_WIN32)
  // Windows long filename
  static std::wstring UNC(L"\\\\?\\UNC");
  static std::wstring PREFIX(L"\\\\?\\");

  if (this->IsAbsolute() && path.length() > _MAX_PATH - 12) {
    if (this->HasRootName() && path[0] == L'\\') {
      path = UNC + path.substr(1);
    } else {
      path = PREFIX + path;
    }
  }
#endif
}